

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Softmax.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeSoftmax(ConvertLayerParameters layerParameters)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  string *psVar4;
  string *layerType;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar5;
  reference __x;
  NetParameter *in_stack_00000008;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  SoftmaxParameter *local_e0;
  SoftmaxParameter *caffeLayerParams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *topName;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *bottomName;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  allocator local_51;
  string local_50;
  NeuralNetworkLayer *local_30;
  NeuralNetworkLayer *specLayer;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  LayerParameter *caffeLayer;
  int layerId;
  
  caffeLayer._4_4_ = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  mappingDataBlobNames =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)caffe::NetParameter::layer(in_stack_00000008,caffeLayer._4_4_);
  nnWrite = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)layerParameters._24_8_;
  specLayer = (NeuralNetworkLayer *)layerParameters.protoweights;
  local_30 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                       ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                        layerParameters.protoweights);
  iVar2 = caffe::LayerParameter::bottom_size((LayerParameter *)mappingDataBlobNames);
  if (iVar2 == 1) {
    iVar2 = caffe::LayerParameter::top_size((LayerParameter *)mappingDataBlobNames);
    if (iVar2 == 1) goto LAB_0073b1c0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"Must have 1 input and 1 output",&local_51);
  psVar4 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  layerType = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  errorInCaffeProto(&local_50,psVar4,layerType);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
LAB_0073b1c0:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&top.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  pRVar5 = caffe::LayerParameter::bottom_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  __end1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(pRVar5);
  bottomName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               google::protobuf::
               RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end(pRVar5);
  while( true ) {
    bVar1 = google::protobuf::internal::
            RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!=(&__end1,(iterator *)&bottomName);
    if (!bVar1) break;
    __x = google::protobuf::internal::
          RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&__end1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  pRVar5 = caffe::LayerParameter::top_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  __end1_1 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(pRVar5);
  topName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            google::protobuf::
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::end(pRVar5);
  while( true ) {
    bVar1 = google::protobuf::internal::
            RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!=(&__end1_1,(iterator *)&topName);
    if (!bVar1) break;
    caffeLayerParams =
         (SoftmaxParameter *)
         google::protobuf::internal::
         RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,(value_type *)caffeLayerParams);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  psVar4 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  convertCaffeMetadata
            (psVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&top.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,(RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)specLayer,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)nnWrite);
  local_e0 = caffe::LayerParameter::softmax_param((LayerParameter *)mappingDataBlobNames);
  iVar3 = caffe::SoftmaxParameter::axis(local_e0);
  if (iVar3 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"axis",&local_101);
    psVar4 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"Softmax",&local_129);
    iVar3 = caffe::SoftmaxParameter::axis(local_e0);
    std::__cxx11::to_string(&local_150,iVar3);
    unsupportedCaffeParrameterWithOption(&local_100,psVar4,&local_128,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  CoreML::Specification::NeuralNetworkLayer::mutable_softmax(local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&top.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeSoftmax(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;

    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::SoftmaxParameter& caffeLayerParams = caffeLayer.softmax_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.axis() !=1 ){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(), "Softmax", std::to_string(caffeLayerParams.axis()));
    }
    //***************************************************************
    (void) specLayer->mutable_softmax();
}